

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file.cc
# Opt level: O0

void __thiscall
google::protobuf::compiler::java::
GenerateSibling<google::protobuf::compiler::java::MessageGenerator,google::protobuf::Descriptor>
          (java *this,string *package_dir,string *java_package,Descriptor *descriptor,
          GeneratorContext *context,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *file_list,bool annotate_code,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *annotation_list,string *name_suffix,MessageGenerator *generator,bool opensource_runtime,
          offset_in_MessageGenerator_to_subr pfn)

{
  pointer pZVar1;
  FileDescriptor *this_00;
  ulong uVar2;
  AlphaNum *this_01;
  AlphaNum *d;
  undefined7 in_stack_00000009;
  undefined7 in_stack_00000029;
  code *local_408;
  unique_ptr<google::protobuf::io::ZeroCopyOutputStream,_std::default_delete<google::protobuf::io::ZeroCopyOutputStream>_>
  *local_3e8;
  unique_ptr<google::protobuf::io::ZeroCopyOutputStream,_std::default_delete<google::protobuf::io::ZeroCopyOutputStream>_>
  local_3a0;
  unique_ptr<google::protobuf::io::ZeroCopyOutputStream,_std::default_delete<google::protobuf::io::ZeroCopyOutputStream>_>
  info_output;
  string_view local_388;
  string_view local_378;
  string_view local_368;
  string_view local_358;
  undefined1 local_348 [8];
  Printer printer;
  unique_ptr<google::protobuf::io::ZeroCopyOutputStream,_std::default_delete<google::protobuf::io::ZeroCopyOutputStream>_>
  local_210;
  unique_ptr<google::protobuf::io::ZeroCopyOutputStream,_std::default_delete<google::protobuf::io::ZeroCopyOutputStream>_>
  output;
  AnnotationProtoCollector<google::protobuf::GeneratedCodeInfo> annotation_collector;
  GeneratedCodeInfo annotations;
  AlphaNum local_198;
  undefined1 local_168 [8];
  string info_full_path;
  AlphaNum local_138;
  AlphaNum local_108;
  string_view local_d8;
  AlphaNum local_c8;
  AlphaNum local_98;
  undefined1 local_68 [8];
  string filename;
  offset_in_MessageGenerator_to_subr pfn_local;
  bool opensource_runtime_local;
  bool annotate_code_local;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *file_list_local;
  GeneratorContext *context_local;
  Descriptor *descriptor_local;
  string *java_package_local;
  string *package_dir_local;
  
  filename.field_2._8_8_ = CONCAT71(in_stack_00000029,opensource_runtime);
  d = (AlphaNum *)java_package;
  absl::lts_20250127::AlphaNum::AlphaNum<std::allocator<char>>
            (&local_98,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this);
  local_d8 = Descriptor::name((Descriptor *)java_package);
  absl::lts_20250127::AlphaNum::AlphaNum(&local_c8,local_d8);
  this_01 = &local_108;
  absl::lts_20250127::AlphaNum::AlphaNum<std::allocator<char>>
            (this_01,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     annotation_list);
  absl::lts_20250127::AlphaNum::AlphaNum(&local_138,".java");
  absl::lts_20250127::StrCat_abi_cxx11_
            ((string *)local_68,(lts_20250127 *)&local_98,&local_c8,this_01,&local_138,d);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)context,(string *)local_68);
  absl::lts_20250127::AlphaNum::AlphaNum<std::allocator<char>>
            (&local_198,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_68);
  absl::lts_20250127::AlphaNum::AlphaNum
            ((AlphaNum *)&annotations.field_0._impl_._cached_size_,".pb.meta");
  absl::lts_20250127::StrCat_abi_cxx11_
            ((string *)local_168,(lts_20250127 *)&local_198,
             (AlphaNum *)&annotations.field_0._impl_._cached_size_,this_01);
  GeneratedCodeInfo::GeneratedCodeInfo((GeneratedCodeInfo *)&annotation_collector.annotation_proto_)
  ;
  protobuf::io::AnnotationProtoCollector<google::protobuf::GeneratedCodeInfo>::
  AnnotationProtoCollector
            ((AnnotationProtoCollector<google::protobuf::GeneratedCodeInfo> *)&output,
             (GeneratedCodeInfo *)&annotation_collector.annotation_proto_);
  pZVar1 = (pointer)(**(code **)(*(long *)descriptor + 0x10))(descriptor,local_68);
  std::
  unique_ptr<google::protobuf::io::ZeroCopyOutputStream,std::default_delete<google::protobuf::io::ZeroCopyOutputStream>>
  ::unique_ptr<std::default_delete<google::protobuf::io::ZeroCopyOutputStream>,void>
            ((unique_ptr<google::protobuf::io::ZeroCopyOutputStream,std::default_delete<google::protobuf::io::ZeroCopyOutputStream>>
              *)&local_210,pZVar1);
  pZVar1 = std::
           unique_ptr<google::protobuf::io::ZeroCopyOutputStream,_std::default_delete<google::protobuf::io::ZeroCopyOutputStream>_>
           ::get(&local_210);
  if (((ulong)file_list & 1) == 0) {
    local_3e8 = (unique_ptr<google::protobuf::io::ZeroCopyOutputStream,_std::default_delete<google::protobuf::io::ZeroCopyOutputStream>_>
                 *)0x0;
  }
  else {
    local_3e8 = &output;
  }
  protobuf::io::Printer::Printer((Printer *)local_348,pZVar1,'$',(AnnotationCollector *)local_3e8);
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            (&local_358,
             "// Generated by the protocol buffer compiler.  DO NOT EDIT!\n// NO CHECKED-IN PROTOBUF GENCODE\n// source: $filename$\n"
            );
  this_00 = Descriptor::file((Descriptor *)java_package);
  local_368 = FileDescriptor::name(this_00);
  protobuf::io::Printer::Print<char[9],std::basic_string_view<char,std::char_traits<char>>>
            ((Printer *)local_348,local_358,(char (*) [9])"filename",&local_368);
  if (((ulong)generator & 1) != 0) {
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (&local_378,"// Protobuf Java Version: $protobuf_java_version$\n");
    protobuf::io::Printer::Print<char[22],char[11]>
              ((Printer *)local_348,local_378,(char (*) [22])"protobuf_java_version",
               (char (*) [11])"4.31.0-dev");
  }
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_388,"\n");
  protobuf::io::Printer::Print<>((Printer *)local_348,local_388);
  uVar2 = std::__cxx11::string::empty();
  if ((uVar2 & 1) == 0) {
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              ((basic_string_view<char,_std::char_traits<char>_> *)&info_output,
               "package $package$;\n\n");
    protobuf::io::Printer::Print<char[8],std::__cxx11::string>
              ((Printer *)local_348,_info_output,(char (*) [8])0x208ae53,package_dir);
  }
  if ((filename.field_2._8_8_ & 1) == 0) {
    local_408 = (code *)filename.field_2._8_8_;
  }
  else {
    local_408 = *(code **)(*(long *)(&name_suffix->_M_dataplus + pfn) + filename.field_2._8_8_ + -1)
    ;
  }
  (*local_408)(&name_suffix->_M_dataplus + pfn,local_348);
  if (((ulong)file_list & 1) != 0) {
    pZVar1 = (pointer)(**(code **)(*(long *)descriptor + 0x10))(descriptor,local_168);
    std::
    unique_ptr<google::protobuf::io::ZeroCopyOutputStream,std::default_delete<google::protobuf::io::ZeroCopyOutputStream>>
    ::unique_ptr<std::default_delete<google::protobuf::io::ZeroCopyOutputStream>,void>
              ((unique_ptr<google::protobuf::io::ZeroCopyOutputStream,std::default_delete<google::protobuf::io::ZeroCopyOutputStream>>
                *)&local_3a0,pZVar1);
    pZVar1 = std::
             unique_ptr<google::protobuf::io::ZeroCopyOutputStream,_std::default_delete<google::protobuf::io::ZeroCopyOutputStream>_>
             ::get(&local_3a0);
    protobuf::MessageLite::SerializeToZeroCopyStream
              ((MessageLite *)&annotation_collector.annotation_proto_,pZVar1);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)CONCAT71(in_stack_00000009,annotate_code),(value_type *)local_168);
    std::
    unique_ptr<google::protobuf::io::ZeroCopyOutputStream,_std::default_delete<google::protobuf::io::ZeroCopyOutputStream>_>
    ::~unique_ptr(&local_3a0);
  }
  protobuf::io::Printer::~Printer((Printer *)local_348);
  std::
  unique_ptr<google::protobuf::io::ZeroCopyOutputStream,_std::default_delete<google::protobuf::io::ZeroCopyOutputStream>_>
  ::~unique_ptr(&local_210);
  protobuf::io::AnnotationProtoCollector<google::protobuf::GeneratedCodeInfo>::
  ~AnnotationProtoCollector
            ((AnnotationProtoCollector<google::protobuf::GeneratedCodeInfo> *)&output);
  GeneratedCodeInfo::~GeneratedCodeInfo
            ((GeneratedCodeInfo *)&annotation_collector.annotation_proto_);
  std::__cxx11::string::~string((string *)local_168);
  std::__cxx11::string::~string((string *)local_68);
  return;
}

Assistant:

static void GenerateSibling(
    const std::string& package_dir, const std::string& java_package,
    const DescriptorClass* descriptor, GeneratorContext* context,
    std::vector<std::string>* file_list, bool annotate_code,
    std::vector<std::string>* annotation_list, const std::string& name_suffix,
    GeneratorClass* generator, bool opensource_runtime,
    void (GeneratorClass::*pfn)(io::Printer* printer)) {
  std::string filename =
      absl::StrCat(package_dir, descriptor->name(), name_suffix, ".java");
  file_list->push_back(filename);
  std::string info_full_path = absl::StrCat(filename, ".pb.meta");
  GeneratedCodeInfo annotations;
  io::AnnotationProtoCollector<GeneratedCodeInfo> annotation_collector(
      &annotations);

  std::unique_ptr<io::ZeroCopyOutputStream> output(context->Open(filename));
  io::Printer printer(output.get(), '$',
                      annotate_code ? &annotation_collector : nullptr);

  printer.Print(
      "// Generated by the protocol buffer compiler.  DO NOT EDIT!\n"
      "// NO CHECKED-IN PROTOBUF "
      // Intentional line breaker
      "GENCODE\n"
      "// source: $filename$\n",
      "filename", descriptor->file()->name());
  if (opensource_runtime) {
    printer.Print("// Protobuf Java Version: $protobuf_java_version$\n",
                  "protobuf_java_version", PROTOBUF_JAVA_VERSION_STRING);
  }
  printer.Print("\n");
  if (!java_package.empty()) {
    printer.Print(
        "package $package$;\n"
        "\n",
        "package", java_package);
  }

  (generator->*pfn)(&printer);

  if (annotate_code) {
    std::unique_ptr<io::ZeroCopyOutputStream> info_output(
        context->Open(info_full_path));
    annotations.SerializeToZeroCopyStream(info_output.get());
    annotation_list->push_back(info_full_path);
  }
}